

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryBuffer.cpp
# Opt level: O2

bool shouldUseMmap(int FD,size_t FileSize,size_t MapSize,off_t Offset,bool RequiresNullTerminator,
                  int PageSize,bool IsVolatile)

{
  error_code eVar1;
  file_status local_68;
  
  if (!IsVolatile) {
    if (!RequiresNullTerminator || ((uint)PageSize > MapSize || 0x3fff >= MapSize)) {
      return (uint)PageSize <= MapSize && 0x3fff < MapSize;
    }
    if (FileSize == 0xffffffffffffffff) {
      local_68.super_basic_file_status.fs_st_size._0_4_ = 0;
      local_68.super_basic_file_status.fs_st_size._4_4_ = 0;
      local_68.super_basic_file_status.Type = status_error;
      local_68.super_basic_file_status.fs_st_atime_nsec = 0;
      local_68.super_basic_file_status.fs_st_mtime_nsec = 0;
      local_68.super_basic_file_status.fs_st_uid = 0;
      local_68.super_basic_file_status.fs_st_gid = 0;
      local_68.super_basic_file_status.fs_st_atime = 0;
      local_68.super_basic_file_status.fs_st_mtime = 0;
      local_68.super_basic_file_status.Perms = perms_not_known;
      local_68.fs_st_dev = 0;
      local_68.fs_st_nlinks = 0;
      local_68.fs_st_ino = 0;
      eVar1 = llvm::sys::fs::status(FD,&local_68);
      if (eVar1._M_value != 0) {
        return false;
      }
      FileSize = CONCAT44(local_68.super_basic_file_status.fs_st_size._4_4_,
                          (undefined4)local_68.super_basic_file_status.fs_st_size);
    }
    if (FileSize < Offset + MapSize) {
      __assert_fail("End <= FileSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/MemoryBuffer.cpp"
                    ,0x157,"bool shouldUseMmap(int, size_t, size_t, off_t, bool, int, bool)");
    }
    if (Offset + MapSize == FileSize) {
      return (FileSize & (long)(PageSize + -1)) != 0;
    }
  }
  return false;
}

Assistant:

static bool shouldUseMmap(int FD,
                          size_t FileSize,
                          size_t MapSize,
                          off_t Offset,
                          bool RequiresNullTerminator,
                          int PageSize,
                          bool IsVolatile) {
  // mmap may leave the buffer without null terminator if the file size changed
  // by the time the last page is mapped in, so avoid it if the file size is
  // likely to change.
  if (IsVolatile)
    return false;

  // We don't use mmap for small files because this can severely fragment our
  // address space.
  if (MapSize < 4 * 4096 || MapSize < (unsigned)PageSize)
    return false;

  if (!RequiresNullTerminator)
    return true;

  // If we don't know the file size, use fstat to find out.  fstat on an open
  // file descriptor is cheaper than stat on a random path.
  // FIXME: this chunk of code is duplicated, but it avoids a fstat when
  // RequiresNullTerminator = false and MapSize != -1.
  if (FileSize == size_t(-1)) {
    sys::fs::file_status Status;
    if (sys::fs::status(FD, Status))
      return false;
    FileSize = Status.getSize();
  }

  // If we need a null terminator and the end of the map is inside the file,
  // we cannot use mmap.
  size_t End = Offset + MapSize;
  assert(End <= FileSize);
  if (End != FileSize)
    return false;

  // Don't try to map files that are exactly a multiple of the system page size
  // if we need a null terminator.
  if ((FileSize & (PageSize -1)) == 0)
    return false;

#if defined(__CYGWIN__)
  // Don't try to map files that are exactly a multiple of the physical page size
  // if we need a null terminator.
  // FIXME: We should reorganize again getPageSize() on Win32.
  if ((FileSize & (4096 - 1)) == 0)
    return false;
#endif

  return true;
}